

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delay_estimator_wrapper.cc
# Opt level: O0

int WebRtc_DelayEstimatorProcessFloat(void *handle,float *near_spectrum,int spectrum_size)

{
  uint32_t binary_near_spectrum;
  uint32_t binary_spectrum;
  DelayEstimator *self;
  int spectrum_size_local;
  float *near_spectrum_local;
  void *handle_local;
  
  if (handle == (void *)0x0) {
    handle_local._4_4_ = -1;
  }
  else if (near_spectrum == (float *)0x0) {
    handle_local._4_4_ = -1;
  }
  else if (spectrum_size == *(int *)((long)handle + 0xc)) {
    binary_near_spectrum = BinarySpectrumFloat(near_spectrum,*handle,(int *)((long)handle + 8));
    handle_local._4_4_ =
         WebRtc_ProcessBinarySpectrum
                   (*(BinaryDelayEstimator **)((long)handle + 0x10),binary_near_spectrum);
  }
  else {
    handle_local._4_4_ = -1;
  }
  return handle_local._4_4_;
}

Assistant:

int WebRtc_DelayEstimatorProcessFloat(void* handle,
                                      const float* near_spectrum,
                                      int spectrum_size) {
  DelayEstimator* self = (DelayEstimator*) handle;
  uint32_t binary_spectrum = 0;

  if (self == NULL) {
    return -1;
  }
  if (near_spectrum == NULL) {
    // Empty near end spectrum.
    return -1;
  }
  if (spectrum_size != self->spectrum_size) {
    // Data sizes don't match.
    return -1;
  }

  // Get binary spectrum.
  binary_spectrum = BinarySpectrumFloat(near_spectrum, self->mean_near_spectrum,
                                        &(self->near_spectrum_initialized));

  return WebRtc_ProcessBinarySpectrum(self->binary_handle, binary_spectrum);
}